

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  stbi__context *psVar1;
  bool bVar2;
  int iVar3;
  stbi__jpeg *z;
  stbi__gif *g;
  void *pvVar4;
  int iVar5;
  long in_FS_OFFSET;
  stbi__png local_58;
  
  z = (stbi__jpeg *)malloc(0x4888);
  z->s = s;
  iVar3 = stbi__decode_jpeg_header(z,2);
  if (iVar3 == 0) {
    psVar1 = z->s;
    psVar1->img_buffer = psVar1->img_buffer_original;
    psVar1->img_buffer_end = psVar1->img_buffer_original_end;
  }
  else {
    if (x != (int *)0x0) {
      *x = z->s->img_x;
    }
    if (y != (int *)0x0) {
      *y = z->s->img_y;
    }
    if (comp != (int *)0x0) {
      bVar2 = 2 < z->s->img_n;
      *comp = bVar2 + 1 + (uint)bVar2;
    }
  }
  free(z);
  iVar5 = 1;
  if ((iVar3 == 0) && (local_58.s = s, iVar3 = stbi__png_info_raw(&local_58,x,y,comp), iVar3 == 0))
  {
    g = (stbi__gif *)malloc(0x8870);
    iVar3 = stbi__gif_header(s,g,comp,1);
    if (iVar3 == 0) {
      free(g);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      if (x != (int *)0x0) {
        *x = g->w;
      }
      if (y != (int *)0x0) {
        *y = g->h;
      }
      free(g);
    }
    iVar5 = 1;
    if (iVar3 == 0) {
      local_58.out._4_4_ = 0xff;
      pvVar4 = stbi__bmp_parse_header(s,(stbi__bmp_data *)&local_58);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (pvVar4 != (void *)0x0) {
        if (x != (int *)0x0) {
          *x = s->img_x;
        }
        if (y != (int *)0x0) {
          *y = s->img_y;
        }
        if (comp != (int *)0x0) {
          *comp = 4 - (uint)((int)local_58.out == 0 ||
                            (int)local_58.out == -0x1000000 && (int)local_58.s == 0x18);
        }
        if (pvVar4 != (void *)0x0) {
          return 1;
        }
      }
      iVar3 = stbi__psd_info(s,x,y,comp);
      if ((((iVar3 == 0) && (iVar3 = stbi__pic_info(s,x,y,comp), iVar3 == 0)) &&
          (iVar3 = stbi__pnm_info(s,x,y,comp), iVar3 == 0)) &&
         ((iVar3 = stbi__hdr_info(s,x,y,comp), iVar3 == 0 &&
          (iVar3 = stbi__tga_info(s,x,y,comp), iVar3 == 0)))) {
        *(char **)(in_FS_OFFSET + -0x10) = "unknown image type";
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}